

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

Expression * __thiscall
soul::ResolutionPass::ConstantFolder::visit(ConstantFolder *this,FunctionCall *c)

{
  byte bVar1;
  IntrinsicType i;
  bool bVar2;
  uint uVar3;
  size_t sVar4;
  CommaSeparatedList *pCVar5;
  pool_ref<soul::AST::Expression> *ppVar6;
  reference ppVar7;
  VariableDeclaration *pVVar8;
  Expression *pEVar9;
  Constant *pCVar10;
  size_t sVar11;
  Context *c_00;
  Value local_298;
  ArrayView<soul::Value> local_258;
  undefined1 local_248 [8];
  Value result;
  pool_ptr<soul::AST::Constant> local_200;
  pool_ptr<soul::AST::Constant> constant;
  pool_ref<soul::AST::Expression> *arg;
  pool_ref<soul::AST::Expression> *__end5;
  pool_ref<soul::AST::Expression> *__begin5;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *__range5;
  ArrayWithPreallocation<soul::Value,_4UL> constantArgs;
  undefined1 local_88 [8];
  Type paramType;
  __normal_iterator<soul::pool_ref<soul::AST::VariableDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>_>
  local_60;
  pool_ref<soul::AST::VariableDeclaration> local_58;
  pool_ref<soul::AST::VariableDeclaration> param;
  pool_ref<soul::AST::Expression> *a;
  pool_ref<soul::AST::Expression> *__end3;
  pool_ref<soul::AST::Expression> *__begin3;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *__range3;
  iterator iStack_28;
  bool savedIsUsedAsReference;
  iterator parameters;
  FunctionCall *c_local;
  ConstantFolder *this_local;
  
  parameters._M_current = (pool_ref<soul::AST::VariableDeclaration> *)c;
  sVar4 = AST::CallOrCastBase::getNumArguments(&c->super_CallOrCastBase);
  if (sVar4 == 0) goto LAB_004545cb;
  iStack_28 = std::
              vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
              ::begin((vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                       *)&(parameters._M_current[8].object)->isFunctionParameter);
  bVar1 = (this->super_ErrorIgnoringRewritingASTVisitor).field_0x31;
  pCVar5 = pool_ptr<soul::AST::CommaSeparatedList>::operator->
                     ((pool_ptr<soul::AST::CommaSeparatedList> *)(parameters._M_current + 6));
  __end3 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::begin(&pCVar5->items)
  ;
  ppVar6 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::end(&pCVar5->items);
  for (; __end3 != ppVar6; __end3 = __end3 + 1) {
    param.object = (VariableDeclaration *)__end3;
    local_60 = __gnu_cxx::
               __normal_iterator<soul::pool_ref<soul::AST::VariableDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>_>
               ::operator++(&stack0xffffffffffffffd8,0);
    ppVar7 = __gnu_cxx::
             __normal_iterator<soul::pool_ref<soul::AST::VariableDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>_>
             ::operator*(&local_60);
    local_58.object = ppVar7->object;
    pVVar8 = pool_ref<soul::AST::VariableDeclaration>::operator->(&local_58);
    bVar2 = AST::VariableDeclaration::isResolved(pVVar8);
    if (bVar2) {
      pVVar8 = pool_ref<soul::AST::VariableDeclaration>::operator->(&local_58);
      AST::VariableDeclaration::getType((Type *)local_88,pVVar8);
      bVar2 = Type::isReference((Type *)local_88);
      (this->super_ErrorIgnoringRewritingASTVisitor).field_0x31 = bVar2;
      if ((((this->super_ErrorIgnoringRewritingASTVisitor).field_0x31 & 1) != 0) &&
         (bVar2 = Type::isNonConstReference((Type *)local_88), bVar2)) {
        pEVar9 = pool_ref<soul::AST::Expression>::get
                           ((pool_ref<soul::AST::Expression> *)param.object);
        bVar2 = AST::isResolvedAsValue(pEVar9);
        if (bVar2) {
          pEVar9 = pool_ref<soul::AST::Expression>::operator->
                             ((pool_ref<soul::AST::Expression> *)param.object);
          uVar3 = (*(pEVar9->super_Statement).super_ASTObject._vptr_ASTObject[0xf])();
          if ((uVar3 & 1) == 0) {
            pEVar9 = pool_ref<soul::AST::Expression>::operator->
                               ((pool_ref<soul::AST::Expression> *)param.object);
            Errors::cannotPassConstAsNonConstRef<>();
            AST::Context::throwError
                      (&(pEVar9->super_Statement).super_ASTObject.context,
                       (CompileMessage *)(constantArgs.space + 0x1f),false);
          }
        }
      }
      RewritingASTVisitor::replaceExpression
                ((RewritingASTVisitor *)this,(pool_ref<soul::AST::Expression> *)param.object);
      Type::~Type((Type *)local_88);
    }
    pool_ref<soul::AST::VariableDeclaration>::~pool_ref(&local_58);
  }
  (this->super_ErrorIgnoringRewritingASTVisitor).field_0x31 = bVar1 & 1;
  bVar2 = AST::Function::isIntrinsic((Function *)parameters._M_current[8].object);
  if (!bVar2) goto LAB_004545cb;
  ArrayWithPreallocation<soul::Value,_4UL>::ArrayWithPreallocation
            ((ArrayWithPreallocation<soul::Value,_4UL> *)&__range5);
  bVar2 = pool_ptr<soul::AST::CommaSeparatedList>::operator!=
                    ((pool_ptr<soul::AST::CommaSeparatedList> *)(parameters._M_current + 6),
                     (void *)0x0);
  if (bVar2) {
    pCVar5 = pool_ptr<soul::AST::CommaSeparatedList>::operator->
                       ((pool_ptr<soul::AST::CommaSeparatedList> *)(parameters._M_current + 6));
    __end5 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::begin
                       (&pCVar5->items);
    ppVar6 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::end(&pCVar5->items)
    ;
    for (; __end5 != ppVar6; __end5 = __end5 + 1) {
      constant.object = (Constant *)__end5;
      pEVar9 = pool_ref<soul::AST::Expression>::operator->(__end5);
      (*(pEVar9->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_200);
      bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_200);
      if (bVar2) {
        pCVar10 = pool_ptr<soul::AST::Constant>::operator->(&local_200);
        ArrayWithPreallocation<soul::Value,4ul>::emplace_back<soul::Value&>
                  ((ArrayWithPreallocation<soul::Value,4ul> *)&__range5,&pCVar10->value);
        result.allocatedData.allocatedData.space[0]._4_4_ = 0;
      }
      else {
        result.allocatedData.allocatedData.space[0]._4_4_ = 4;
      }
      pool_ptr<soul::AST::Constant>::~pool_ptr(&local_200);
      if (result.allocatedData.allocatedData.space[0]._4_4_ != 0) break;
    }
  }
  sVar4 = ArrayWithPreallocation<soul::Value,_4UL>::size
                    ((ArrayWithPreallocation<soul::Value,_4UL> *)&__range5);
  pCVar5 = pool_ptr<soul::AST::CommaSeparatedList>::operator->
                     ((pool_ptr<soul::AST::CommaSeparatedList> *)(parameters._M_current + 6));
  sVar11 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::size(&pCVar5->items);
  if (sVar4 == sVar11) {
    i = *(IntrinsicType *)
         &parameters._M_current[8].object[1].annotation.properties.
          super__Vector_base<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
    ArrayView<soul::Value>::ArrayView<soul::ArrayWithPreallocation<soul::Value,4ul>>
              (&local_258,(ArrayWithPreallocation<soul::Value,_4UL> *)&__range5);
    performIntrinsic((Value *)local_248,i,local_258);
    bVar2 = soul::Value::isValid((Value *)local_248);
    if (bVar2) {
      c_00 = (Context *)(parameters._M_current + 2);
      soul::Value::Value(&local_298,(Value *)local_248);
      this_local = (ConstantFolder *)createConstant(this,c_00,&local_298);
      soul::Value::~Value(&local_298);
    }
    result.allocatedData.allocatedData.space[0]._5_3_ = 0;
    result.allocatedData.allocatedData.space[0]._4_1_ = bVar2;
    soul::Value::~Value((Value *)local_248);
    if (result.allocatedData.allocatedData.space[0]._4_4_ == 0) goto LAB_00454595;
  }
  else {
LAB_00454595:
    result.allocatedData.allocatedData.space[0]._4_4_ = 0;
  }
  ArrayWithPreallocation<soul::Value,_4UL>::~ArrayWithPreallocation
            ((ArrayWithPreallocation<soul::Value,_4UL> *)&__range5);
  if (result.allocatedData.allocatedData.space[0]._4_4_ != 0) {
    return (Expression *)this_local;
  }
LAB_004545cb:
  ErrorIgnoringRewritingASTVisitor::failIfNotResolved
            (&this->super_ErrorIgnoringRewritingASTVisitor,(Expression *)parameters._M_current);
  return (Expression *)parameters._M_current;
}

Assistant:

AST::Expression& visit (AST::FunctionCall& c) override
        {
            if (c.getNumArguments() != 0)
            {
                auto parameters = c.targetFunction.parameters.begin();
                auto savedIsUsedAsReference = isUsedAsReference;

                for (auto& a : c.arguments->items)
                {
                    auto param = *parameters++;

                    if (param->isResolved())
                    {
                        auto paramType = param->getType();
                        isUsedAsReference = paramType.isReference();

                        if (isUsedAsReference && paramType.isNonConstReference()
                             && AST::isResolvedAsValue (a.get()) && ! a->isAssignable())
                            a->context.throwError (Errors::cannotPassConstAsNonConstRef());

                        replaceExpression (a);
                    }
                }

                isUsedAsReference = savedIsUsedAsReference;

                if (c.targetFunction.isIntrinsic())
                {
                    ArrayWithPreallocation<Value, 4> constantArgs;

                    if (c.arguments != nullptr)
                    {
                        for (auto& arg : c.arguments->items)
                        {
                            if (auto constant = arg->getAsConstant())
                                constantArgs.emplace_back (constant->value);
                            else
                                break;
                        }
                    }

                    if (constantArgs.size() == c.arguments->items.size())
                    {
                        auto result = performIntrinsic (c.targetFunction.intrinsic, constantArgs);

                        if (result.isValid())
                            return createConstant (c.context, std::move (result));
                    }
                }
            }

            failIfNotResolved (c);
            return c;
        }